

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O1

int __thiscall
RenX_RelayPlugin::send_downstream
          (RenX_RelayPlugin *this,Server *in_server,string_view in_message,
          upstream_server_info *in_server_info)

{
  int iVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  ofstream log_file;
  string local_250;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  if (in_server_info->m_settings->m_log_traffic == true) {
    get_log_filename_abi_cxx11_(&local_250,(RenX_RelayPlugin *)in_server,in_server,in_server_info);
    std::ofstream::ofstream(&local_230,(string *)&local_250,_S_out|_S_bin|_S_app);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_250._M_dataplus._M_p._1_7_,local_250._M_dataplus._M_p._0_1_) !=
        &local_250.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_250._M_dataplus._M_p._1_7_,local_250._M_dataplus._M_p._0_1_),
                      local_250.field_2._M_allocated_capacity + 1);
    }
    if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
      local_250._M_dataplus._M_p._0_1_ = 0x5b;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,(char *)&local_250,1);
      __s = (char *)getTimeFormat("%H:%M:%S");
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] (",3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(in_server_info->m_settings->m_label)._M_dataplus._M_p,
                          (in_server_info->m_settings->m_label)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> RenX::Server): ",0x13);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,in_message._M_str,in_message._M_len);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sendData;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  iVar1 = RenX::Server::sendData(in_server,in_message._M_len,in_message._M_str);
  return iVar1;
}

Assistant:

int RenX_RelayPlugin::send_downstream(RenX::Server& in_server, std::string_view in_message, upstream_server_info& in_server_info) {
	if (in_server_info.m_settings->m_log_traffic) {
		std::ofstream log_file{ get_log_filename(in_server, in_server_info), std::ios::out | std::ios::app | std::ios::binary };
		if (log_file) {
			log_file << '[' << getTimeFormat("%H:%M:%S") << "] (" << in_server_info.m_settings->m_label << " -> RenX::Server): " << in_message << std::endl;
		}
	}

	return in_server.sendData(in_message);
}